

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O3

void __thiscall
HMatrix::setup(HMatrix *this,int numCol_,int numRow_,int *Astart_,int *Aindex_,double *Avalue_,
              int *nonbasicFlag_)

{
  vector<int,_std::allocator<int>_> *this_00;
  int *piVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer pdVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  size_type __new_size;
  vector<int,_std::allocator<int>_> AR_Bend;
  value_type local_6c;
  vector<int,_std::allocator<int>_> local_68;
  vector<int,_std::allocator<int>_> *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  vector<double,_std::allocator<double>_> *local_38;
  
  this->numCol = numCol_;
  this->numRow = numRow_;
  local_40 = &this->Astart;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)local_40,Astart_,Astart_ + (long)numCol_ + 1);
  __new_size = (size_type)(Astart_ + (long)numCol_ + 1)[-1];
  local_48 = &this->Aindex;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)local_48,Aindex_,Aindex_ + __new_size);
  local_38 = &this->Avalue;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)local_38,Avalue_,Avalue_ + __new_size);
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&this->ARstart,(long)this->numRow + 1);
  this_00 = &this->AR_Nend;
  local_6c = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(this_00,(long)this->numRow,&local_6c);
  local_6c = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(&local_68,(long)this->numRow,&local_6c);
  if (0 < this->numCol) {
    piVar3 = (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      iVar9 = piVar3[lVar10];
      lVar11 = (long)iVar9;
      if (nonbasicFlag_[lVar10] == 0) {
        if (iVar9 < piVar3[lVar10 + 1]) {
          do {
            local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[piVar4[lVar11]] =
                 local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[piVar4[lVar11]] + 1;
            lVar11 = lVar11 + 1;
          } while (lVar11 < piVar3[lVar10 + 1]);
        }
      }
      else if (iVar9 < piVar3[lVar10 + 1]) {
        do {
          piVar1 = piVar5 + piVar4[lVar11];
          *piVar1 = *piVar1 + 1;
          lVar11 = lVar11 + 1;
        } while (lVar11 < piVar3[lVar10 + 1]);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->numCol);
  }
  piVar3 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *piVar3 = 0;
  if (0 < this->numRow) {
    piVar4 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar9 = 0;
    lVar10 = 0;
    do {
      iVar9 = iVar9 + piVar4[lVar10] +
              local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar10];
      piVar3[lVar10 + 1] = iVar9;
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->numRow);
    if (0 < this->numRow) {
      piVar4 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = 0;
      do {
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar10] = piVar4[lVar10] + piVar3[lVar10];
        piVar4[lVar10] = piVar3[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar10 < this->numRow);
    }
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->ARindex,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&this->ARvalue,__new_size);
  if (0 < this->numCol) {
    piVar3 = (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (local_38->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      iVar9 = piVar3[lVar10];
      lVar11 = (long)iVar9;
      if (nonbasicFlag_[lVar10] == 0) {
        if (iVar9 < piVar3[lVar10 + 1]) {
          do {
            iVar9 = piVar4[lVar11];
            iVar2 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar9];
            local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar9] = iVar2 + 1;
            piVar6[iVar2] = (int)lVar10;
            pdVar8[iVar2] = pdVar7[lVar11];
            lVar11 = lVar11 + 1;
          } while (lVar11 < piVar3[lVar10 + 1]);
        }
      }
      else if (iVar9 < piVar3[lVar10 + 1]) {
        do {
          iVar9 = piVar4[lVar11];
          iVar2 = piVar5[iVar9];
          piVar5[iVar9] = iVar2 + 1;
          piVar6[iVar2] = (int)lVar10;
          pdVar8[iVar2] = pdVar7[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar11 < piVar3[lVar10 + 1]);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->numCol);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HMatrix::setup(int numCol_, int numRow_, const int *Astart_,
		    const int *Aindex_, const double *Avalue_, const int *nonbasicFlag_) {
  //Copy the A matrix and setup row-wise matrix with the nonbasic
  //columns before the basic columns for a general set of nonbasic
  //variables
  //
  //Copy A
  numCol = numCol_;
  numRow = numRow_;
  Astart.assign(Astart_, Astart_ + numCol_ + 1);
  
  int AcountX = Astart_[numCol_];
  Aindex.assign(Aindex_, Aindex_ + AcountX);
  Avalue.assign(Avalue_, Avalue_ + AcountX);

  // Build row copy - pointers
  vector<int> AR_Bend;
  ARstart.resize(numRow + 1);
  AR_Nend.assign(numRow, 0);
  AR_Bend.assign(numRow, 0);
  //Count the nonzeros of nonbasic and basic columns in each row
  for (int iCol = 0; iCol < numCol; iCol++) {
    if (nonbasicFlag_[iCol]) {
      for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
	int iRow = Aindex[k];
	AR_Nend[iRow]++;
      }
    } else {
      for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
	int iRow = Aindex[k];
	AR_Bend[iRow]++;
      }
    }
  }
  ARstart[0] = 0;
  for (int i = 0; i < numRow; i++)
    ARstart[i+1] = ARstart[i] + AR_Nend[i] + AR_Bend[i];
  for (int i = 0; i < numRow; i++) {
    AR_Bend[i] = ARstart[i] + AR_Nend[i];
    AR_Nend[i] = ARstart[i];
  }
  // Build row copy - elements
  ARindex.resize(AcountX);
  ARvalue.resize(AcountX);
  for (int iCol = 0; iCol < numCol; iCol++) {
    if (nonbasicFlag_[iCol]) {
      for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
	int iRow = Aindex[k];
	int iPut = AR_Nend[iRow]++;
	ARindex[iPut] = iCol;
	ARvalue[iPut] = Avalue[k];
      }
    } else {
      for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
	int iRow = Aindex[k];
	int iPut = AR_Bend[iRow]++;
	ARindex[iPut] = iCol;
	ARvalue[iPut] = Avalue[k];
      }
    }
  }
#ifdef JAJH_dev
  assert(setup_ok(nonbasicFlag_));
#endif
}